

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::number_matcher<callbacks_proxy<mock_json_callbacks>_>::
do_exponent_digit_state
          (number_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          parser<callbacks_proxy<mock_json_callbacks>_> *parser,char c)

{
  int iVar1;
  error_code local_20;
  
  iVar1 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
  if (1 < iVar1 - 9U) {
    assert_failed("this->get_state () == exponent_digit_state || this->get_state () == exponent_initial_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2ab);
  }
  if ((this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).field_0xd != '\x01') {
    if ((byte)(c - 0x30U) < 10) {
      (this->fp_acc_).exponent = ((uint)(byte)c + (this->fp_acc_).exponent * 10) - 0x30;
      (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 10;
    }
    else {
      if (iVar1 != 9) {
        complete(this,parser);
        return false;
      }
      local_20._M_cat = get_error_category();
      local_20._M_value = 0xb;
      matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_20);
    }
    return true;
  }
  assert_failed("!is_integer_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x2ac);
}

Assistant:

bool number_matcher<Callbacks>::do_exponent_digit_state (parser<Callbacks> & parser,
                                                                     char const c) {
                PSTORE_ASSERT (this->get_state () == exponent_digit_state ||
                               this->get_state () == exponent_initial_digit_state);
                PSTORE_ASSERT (!is_integer_);

                bool match = true;
                if (c >= '0' && c <= '9') {
                    fp_acc_.exponent = fp_acc_.exponent * 10U + static_cast<unsigned> (c - '0');
                    this->set_state (exponent_digit_state);
                } else {
                    if (this->get_state () == exponent_initial_digit_state) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        match = false;
                        this->complete (parser);
                    }
                }
                return match;
            }